

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

string * __thiscall cmMakefile::GetSafeDefinition(cmMakefile *this,string *name)

{
  string *psVar1;
  
  if (GetSafeDefinition(std::__cxx11::string_const&)::empty_abi_cxx11_ == '\0') {
    GetSafeDefinition();
  }
  psVar1 = GetDef(this,name);
  if (psVar1 == (string *)0x0) {
    psVar1 = &GetSafeDefinition(std::__cxx11::string_const&)::empty_abi_cxx11_;
  }
  return psVar1;
}

Assistant:

const std::string& cmMakefile::GetSafeDefinition(const std::string& name) const
{
  static std::string const empty;
  const std::string* def = GetDef(name);
  if (!def) {
    return empty;
  }
  return *def;
}